

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::get
          (RaceSuccessfulPromiseNodeBase *this,ExceptionOrValue *output)

{
  Exception *pEVar1;
  Exception *exception;
  Exception *_exception2922;
  ExceptionOrValue *output_local;
  RaceSuccessfulPromiseNodeBase *this_local;
  
  pEVar1 = readMaybe<kj::Exception>(&this->output->exception);
  if (pEVar1 == (Exception *)0x0) {
    (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])(this,output);
  }
  else {
    pEVar1 = mv<kj::Exception>(pEVar1);
    ExceptionOrValue::addException(output,pEVar1);
  }
  return;
}

Assistant:

void RaceSuccessfulPromiseNodeBase::get(ExceptionOrValue &output) noexcept {
  KJ_IF_SOME(exception, this->output.exception) {
    output.addException(kj::mv(exception));
  } else {
    getNoError(output);
  }
}